

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O2

int Assimp::strtol10(char *in,char **out)

{
  char cVar1;
  uint uVar2;
  
  cVar1 = *in;
  uVar2 = strtoul10(in + (cVar1 == '+' || cVar1 == '-'),out);
  if (cVar1 == '-') {
    uVar2 = -uVar2;
  }
  return uVar2;
}

Assistant:

inline
int strtol10( const char* in, const char** out=0) {
    bool inv = (*in=='-');
    if ( inv || *in == '+' ) {
        ++in;
    }

    int value = strtoul10(in,out);
    if (inv) {
        value = -value;
    }
    return value;
}